

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_3f1b8ca::MemPoolAccept::PreChecks
          (MemPoolAccept *this,ATMPArgs *args,Workspace *ws)

{
  CCoinsViewCache *this_00;
  TxValidationState *this_01;
  CAmount *nFeeDelta;
  unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_> *this_02;
  bool *pbVar1;
  undefined1 *puVar2;
  int iVar3;
  CTransactionRef *tx;
  Txid *hash;
  CTransaction *tx_00;
  vector<COutPoint,std::allocator<COutPoint>> *this_03;
  CTxMemPool *pCVar4;
  pointer ppCVar5;
  pointer pCVar6;
  iterator __position;
  BlockManager *this_04;
  pointer ppCVar7;
  _Head_base<0UL,_CTxMemPoolEntry_*,_false> __ptr;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  LockPoints lp;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  undefined1 uVar14;
  bool bVar15;
  byte bVar16;
  bool bVar17;
  undefined1 uVar18;
  CBlockIndex **ppCVar19;
  int64_t iVar20;
  CTransaction *tx_01;
  const_iterator cVar21;
  CCoinsViewCache *this_05;
  CBlockIndex *pCVar22;
  Coin *pCVar23;
  _Head_base<0UL,_CTxMemPoolEntry_*,_false> this_06;
  int64_t iVar24;
  CAmount CVar25;
  T *pTVar26;
  long lVar27;
  Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
  *result;
  _Alloc_hider _Var28;
  uint entry_height;
  pointer pCVar29;
  ulong uVar30;
  CTxIn *txin;
  uint64_t entry_sequence;
  long in_FS_OFFSET;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar31;
  int64_t nSigOpsCost;
  optional<LockPoints> lock_points;
  Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
  ancestors_retry;
  string error_message;
  Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
  ancestors;
  string reason;
  Limits local_198;
  Limits local_178;
  int64_t local_158;
  _Storage<LockPoints,_true> local_150;
  char local_138;
  string local_130;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100 [3];
  __index_type local_d0;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_98 [3];
  __index_type local_68;
  string local_58;
  long local_38;
  long *args_1;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tx = ws->m_ptx;
  hash = ws->m_hash;
  tx_00 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar24 = args->m_accept_time;
  bVar17 = args->m_bypass_limits;
  this_03 = (vector<COutPoint,std::allocator<COutPoint>> *)args->m_coins_to_uncache;
  this_01 = &ws->m_state;
  bVar15 = CheckTransaction(tx_00,this_01);
  if (bVar15) {
    bVar15 = CTransaction::IsCoinBase(tx_00);
    if (bVar15) {
      puVar2 = local_a8 + 0x10;
      local_a8[0] = SUB81(puVar2,0);
      local_a8._1_7_ = (undefined7)((ulong)puVar2 >> 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"coinbase","");
      local_110._0_8_ = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
      bVar16 = ValidationState<TxValidationResult>::Invalid
                         (&this_01->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                          (string *)local_a8,(string *)local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._0_8_ != local_100) {
        operator_delete((void *)local_110._0_8_,
                        CONCAT71(local_100[0]._M_allocated_capacity._1_7_,
                                 local_100[0]._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_a8._1_7_,local_a8[0]) ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2) goto LAB_00af0adc;
      lVar27 = CONCAT71(aaStack_98[0]._M_allocated_capacity._1_7_,aaStack_98[0]._M_local_buf[0]);
      _Var28._M_p = (pointer)CONCAT71(local_a8._1_7_,local_a8[0]);
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      pCVar4 = this->m_pool;
      if (((pCVar4->m_opts).require_standard != true) ||
         (bVar15 = IsStandardTx(tx_00,&(pCVar4->m_opts).max_datacarrier_bytes,
                                (pCVar4->m_opts).permit_bare_multisig,
                                &(pCVar4->m_opts).dust_relay_feerate,&local_58), bVar15)) {
        local_a8._8_8_ = local_110;
        local_110._0_8_ =
             (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
              )0x0;
        local_a8[0] = (string)0x8f;
        local_a8[1] = 'd';
        local_a8[2] = 0xfb;
        local_a8[3] = '\0';
        local_a8[4] = '\0';
        local_a8[5] = '\0';
        local_a8[6] = '\0';
        local_a8[7] = '\0';
        SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
                  (tx_00,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_a8,
                   &::TX_NO_WITNESS);
        if ((ulong)local_110._0_8_ <
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x41) {
          local_a8[0] = SUB81(local_a8 + 0x10,0);
          local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"tx-size-small","");
          local_110._0_8_ = local_100;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
          bVar16 = ValidationState<TxValidationResult>::Invalid
                             (&this_01->super_ValidationState<TxValidationResult>,TX_NOT_STANDARD,
                              (string *)local_a8,(string *)local_110);
LAB_00af0a7b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._0_8_ != local_100) {
LAB_00af0a8a:
            operator_delete((void *)local_110._0_8_,
                            CONCAT71(local_100[0]._M_allocated_capacity._1_7_,
                                     local_100[0]._M_local_buf[0]) + 1);
          }
          goto LAB_00af0a9a;
        }
        ppCVar5 = (this->m_active_chainstate->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar5 ==
            (this->m_active_chainstate->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pCVar22 = (CBlockIndex *)0x0;
        }
        else {
          pCVar22 = ppCVar5[-1];
        }
        local_a8[0] = SUB81(pCVar22,0);
        local_a8._1_7_ = (undefined7)((ulong)pCVar22 >> 8);
        ppCVar19 = inline_assertion_check<true,CBlockIndex*>
                             ((CBlockIndex **)local_a8,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                              ,0x324,"PreChecks","m_active_chainstate.m_chain.Tip()");
        iVar3 = (*ppCVar19)->nHeight;
        iVar20 = CBlockIndex::GetMedianTimePast(*ppCVar19);
        bVar15 = IsFinalTx(tx_00,iVar3 + 1,iVar20);
        if (!bVar15) {
          local_a8[0] = SUB81(local_a8 + 0x10,0);
          local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"non-final","");
          local_110._0_8_ = local_100;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
          bVar16 = ValidationState<TxValidationResult>::Invalid
                             (&this_01->super_ValidationState<TxValidationResult>,TX_PREMATURE_SPEND
                              ,(string *)local_a8,(string *)local_110);
          goto LAB_00af0a7b;
        }
        local_a8[0] = (string)0x1;
        uVar8 = *(undefined8 *)
                 (tx_00->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar9 = *(undefined8 *)
                 ((tx_00->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar10 = *(undefined8 *)
                  ((tx_00->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar11 = *(undefined8 *)
                  ((tx_00->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        local_a8._1_7_ = (undefined7)uVar8;
        local_a8[8] = (undefined1)((ulong)uVar8 >> 0x38);
        local_a8._9_3_ = (undefined3)uVar9;
        local_a8._12_4_ = (undefined4)((ulong)uVar9 >> 0x18);
        aaStack_98[0]._M_local_buf[0] = (undefined1)((ulong)uVar9 >> 0x38);
        aaStack_98[0]._M_allocated_capacity._1_7_ = (undefined7)uVar10;
        aaStack_98[0]._M_local_buf[8] = (undefined1)((ulong)uVar10 >> 0x38);
        aaStack_98[0]._9_7_ = (undefined7)uVar11;
        aaStack_98[1]._0_1_ = (undefined1)((ulong)uVar11 >> 0x38);
        bVar15 = CTxMemPool::exists(this->m_pool,(GenTxid *)local_a8);
        if (bVar15) {
          local_a8[0] = SUB81(local_a8 + 0x10,0);
          local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a8,"txn-already-in-mempool","");
          local_110._0_8_ = local_100;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
          bVar16 = ValidationState<TxValidationResult>::Invalid
                             (&this_01->super_ValidationState<TxValidationResult>,TX_CONFLICT,
                              (string *)local_a8,(string *)local_110);
          goto LAB_00af0a7b;
        }
        local_a8[0] = (string)0x0;
        uVar8 = *(undefined8 *)(tx_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar9 = *(undefined8 *)((tx_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar10 = *(undefined8 *)
                  ((tx_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar11 = *(undefined8 *)
                  ((tx_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        local_a8._1_7_ = (undefined7)uVar8;
        local_a8[8] = (undefined1)((ulong)uVar8 >> 0x38);
        local_a8._9_3_ = (undefined3)uVar9;
        local_a8._12_4_ = (undefined4)((ulong)uVar9 >> 0x18);
        aaStack_98[0]._M_local_buf[0] = (undefined1)((ulong)uVar9 >> 0x38);
        aaStack_98[0]._M_allocated_capacity._1_7_ = (undefined7)uVar10;
        aaStack_98[0]._M_local_buf[8] = (undefined1)((ulong)uVar10 >> 0x38);
        aaStack_98[0]._9_7_ = (undefined7)uVar11;
        aaStack_98[1]._0_1_ = (undefined1)((ulong)uVar11 >> 0x38);
        bVar15 = CTxMemPool::exists(this->m_pool,(GenTxid *)local_a8);
        if (bVar15) {
          local_a8[0] = SUB81(local_a8 + 0x10,0);
          local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a8,"txn-same-nonwitness-data-in-mempool","");
          local_110._0_8_ = local_100;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
          bVar16 = ValidationState<TxValidationResult>::Invalid
                             (&this_01->super_ValidationState<TxValidationResult>,TX_CONFLICT,
                              (string *)local_a8,(string *)local_110);
          goto LAB_00af0a7b;
        }
        pCVar29 = (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar6 = (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pCVar29 != pCVar6) {
          do {
            tx_01 = CTxMemPool::GetConflictTx(this->m_pool,&pCVar29->prevout);
            if (tx_01 != (CTransaction *)0x0) {
              if (args->m_allow_replacement == false) {
                local_a8[0] = SUB81(local_a8 + 0x10,0);
                local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a8,"bip125-replacement-disallowed","");
                local_110._0_8_ = local_100;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
                bVar16 = ValidationState<TxValidationResult>::Invalid
                                   (&this_01->super_ValidationState<TxValidationResult>,
                                    TX_MEMPOOL_POLICY,(string *)local_a8,(string *)local_110);
                goto LAB_00af0a7b;
              }
              cVar21 = std::
                       _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                       ::find((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                               *)ws,&tx_01->hash);
              if ((_Rb_tree_header *)cVar21._M_node ==
                  &(ws->m_conflicts)._M_t._M_impl.super__Rb_tree_header) {
                if ((((this->m_pool->m_opts).full_rbf == false) &&
                    (bVar15 = SignalsOptInRBF(tx_01), !bVar15)) && (tx_01->version != 3)) {
                  local_a8[0] = SUB81(local_a8 + 0x10,0);
                  local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_a8,"txn-mempool-conflict","");
                  local_110._0_8_ = local_100;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
                  bVar16 = ValidationState<TxValidationResult>::Invalid
                                     (&this_01->super_ValidationState<TxValidationResult>,
                                      TX_MEMPOOL_POLICY,(string *)local_a8,(string *)local_110);
                  goto LAB_00af0a7b;
                }
                std::
                _Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
                ::_M_insert_unique<transaction_identifier<false>const&>
                          ((_Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
                            *)ws,&tx_01->hash);
              }
            }
            pCVar29 = pCVar29 + 1;
          } while (pCVar29 != pCVar6);
        }
        this_00 = &this->m_view;
        CCoinsViewBacked::SetBackend
                  (&this_00->super_CCoinsViewBacked,(CCoinsView *)&this->m_viewmempool);
        this_05 = Chainstate::CoinsTip(this->m_active_chainstate);
        pCVar29 = (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar6 = (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pCVar29 != pCVar6) {
          do {
            bVar15 = CCoinsViewCache::HaveCoinInCache(this_05,&pCVar29->prevout);
            if (!bVar15) {
              __position._M_current = *(COutPoint **)(this_03 + 8);
              if (__position._M_current == *(COutPoint **)(this_03 + 0x10)) {
                std::vector<COutPoint,std::allocator<COutPoint>>::
                _M_realloc_insert<COutPoint_const&>(this_03,__position,&pCVar29->prevout);
              }
              else {
                (__position._M_current)->n = (pCVar29->prevout).n;
                uVar8 = *(undefined8 *)
                         (pCVar29->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
                uVar9 = *(undefined8 *)
                         ((pCVar29->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                         8);
                uVar10 = *(undefined8 *)
                          ((pCVar29->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18);
                *(undefined8 *)
                 (((__position._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                 0x10) = *(undefined8 *)
                          ((pCVar29->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x10);
                *(undefined8 *)
                 (((__position._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                 0x18) = uVar10;
                *(undefined8 *)
                 ((__position._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems =
                     uVar8;
                *(undefined8 *)
                 (((__position._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                 8) = uVar9;
                *(long *)(this_03 + 8) = *(long *)(this_03 + 8) + 0x24;
              }
            }
            bVar15 = CCoinsViewCache::HaveCoin(this_00,&pCVar29->prevout);
            if (!bVar15) {
              if ((tx_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  (tx_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start) goto LAB_00af0df8;
              uVar30 = 0;
              goto LAB_00af0da3;
            }
            pCVar29 = pCVar29 + 1;
          } while (pCVar29 != pCVar6);
        }
        CCoinsViewCache::GetBestBlock((uint256 *)local_a8,this_00);
        CCoinsViewBacked::SetBackend(&this_00->super_CCoinsViewBacked,&this->m_dummy);
        this_04 = this->m_active_chainstate->m_blockman;
        CCoinsViewCache::GetBestBlock((uint256 *)local_a8,this_00);
        pCVar22 = ::node::BlockManager::LookupBlockIndex(this_04,(uint256 *)local_a8);
        ppCVar5 = (this->m_active_chainstate->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppCVar7 = (this->m_active_chainstate->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar27 = (long)ppCVar7 - (long)ppCVar5;
        if (lVar27 == 0) {
          if (pCVar22 != (CBlockIndex *)0x0) goto LAB_00af1aa7;
          pCVar22 = (CBlockIndex *)0x0;
        }
        else {
          if (pCVar22 != ppCVar7[-1]) {
LAB_00af1aa7:
            __assert_fail("m_active_chainstate.m_blockman.LookupBlockIndex(m_view.GetBestBlock()) == m_active_chainstate.m_chain.Tip()"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x374,
                          "bool (anonymous namespace)::MemPoolAccept::PreChecks(ATMPArgs &, Workspace &)"
                         );
          }
          pCVar22 = *(CBlockIndex **)((long)ppCVar5 + lVar27 + -8);
        }
        CalculateLockPointsAtTip
                  ((optional<LockPoints> *)&local_150._M_value,pCVar22,(CCoinsView *)this_00,tx_00);
        if (local_138 != '\x01') {
LAB_00af102d:
          local_a8[0] = SUB81(local_a8 + 0x10,0);
          local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"non-BIP68-final","");
          local_110._0_8_ = local_100;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
          bVar16 = ValidationState<TxValidationResult>::Invalid
                             (&this_01->super_ValidationState<TxValidationResult>,TX_PREMATURE_SPEND
                              ,(string *)local_a8,(string *)local_110);
          goto LAB_00af0a7b;
        }
        ppCVar5 = (this->m_active_chainstate->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar5 ==
            (this->m_active_chainstate->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pCVar22 = (CBlockIndex *)0x0;
        }
        else {
          pCVar22 = ppCVar5[-1];
        }
        bVar15 = CheckSequenceLocksAtTip(pCVar22,&local_150._M_value);
        if (!bVar15) goto LAB_00af102d;
        bVar15 = Consensus::CheckTxInputs
                           (tx_00,this_01,this_00,
                            (int)((ulong)((long)(this->m_active_chainstate->m_chain).vChain.
                                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->m_active_chainstate->m_chain).vChain.
                                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3),
                            &ws->m_base_fees);
        if (bVar15) {
          if (((this->m_pool->m_opts).require_standard == true) &&
             (bVar15 = AreInputsStandard(tx_00,this_00), !bVar15)) {
            local_a8[0] = SUB81(local_a8 + 0x10,0);
            local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a8,"bad-txns-nonstandard-inputs","");
            local_110._0_8_ = local_100;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
            bVar16 = ValidationState<TxValidationResult>::Invalid
                               (&this_01->super_ValidationState<TxValidationResult>,
                                TX_INPUTS_NOT_STANDARD,(string *)local_a8,(string *)local_110);
            goto LAB_00af0a7b;
          }
          if (((tx_00->m_has_witness == true) && ((this->m_pool->m_opts).require_standard == true))
             && (bVar15 = IsWitnessStandard(tx_00,this_00), !bVar15)) {
            local_a8[0] = SUB81(local_a8 + 0x10,0);
            local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a8,"bad-witness-nonstandard","");
            local_110._0_8_ = local_100;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
            bVar16 = ValidationState<TxValidationResult>::Invalid
                               (&this_01->super_ValidationState<TxValidationResult>,
                                TX_WITNESS_MUTATED,(string *)local_a8,(string *)local_110);
            goto LAB_00af0a7b;
          }
          iVar20 = GetTransactionSigOpCost(tx_00,this_00,0x1fffdf);
          nFeeDelta = &ws->m_modified_fees;
          ws->m_modified_fees = ws->m_base_fees;
          local_158 = iVar20;
          CTxMemPool::ApplyDelta(this->m_pool,&hash->m_wrapped,nFeeDelta);
          pCVar29 = (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar6 = (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pCVar29 == pCVar6) {
            bVar16 = 0;
          }
          else {
            do {
              pCVar23 = CCoinsViewCache::AccessCoin(this_00,&pCVar29->prevout);
              bVar16 = pCVar23->field_0x28;
              if ((bVar16 & 1) != 0) break;
              pCVar29 = pCVar29 + 1;
            } while (pCVar29 != pCVar6);
          }
          if (bVar17 == false) {
            entry_sequence = this->m_pool->m_sequence_number;
          }
          else {
            entry_sequence = 0;
          }
          this_06._M_head_impl = (CTxMemPoolEntry *)operator_new(0x110);
          entry_height = (int)((ulong)((long)(this->m_active_chainstate->m_chain).vChain.
                                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->m_active_chainstate->m_chain).vChain.
                                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
          args_1 = (long *)(ulong)entry_height;
          lp.time = local_150._M_value.time;
          lp._0_8_ = local_150._0_8_;
          lp.maxInputBlock = local_150._M_value.maxInputBlock;
          CTxMemPoolEntry::CTxMemPoolEntry
                    (this_06._M_head_impl,tx,ws->m_base_fees,iVar24,entry_height,entry_sequence,
                     (bool)(bVar16 & 1),iVar20,lp);
          this_02 = &ws->m_entry;
          __ptr._M_head_impl =
               (this_02->_M_t).
               super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>._M_t.
               super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
               super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl;
          (this_02->_M_t).
          super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>._M_t.
          super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
          super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl = this_06._M_head_impl;
          if (__ptr._M_head_impl != (CTxMemPoolEntry *)0x0) {
            std::default_delete<CTxMemPoolEntry>::operator()
                      ((default_delete<CTxMemPoolEntry> *)this_02,__ptr._M_head_impl);
            this_06._M_head_impl =
                 (this_02->_M_t).
                 super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>._M_t.
                 super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
                 super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl;
          }
          iVar24 = GetVirtualTransactionSize
                             ((long)(this_06._M_head_impl)->nTxWeight,
                              (this_06._M_head_impl)->sigOpCost,nBytesPerSigOp);
          ws->m_vsize = (long)(int)(uint32_t)iVar24;
          if (iVar20 < 0x3e81) {
            if (bVar17 == false) {
              if ((((ws->m_ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->version != 3) &&
                 (lVar27 = *nFeeDelta,
                 CVar25 = CFeeRate::GetFee(&(this->m_pool->m_opts).min_relay_feerate,
                                           (uint32_t)iVar24), lVar27 < CVar25)) {
                local_a8[0] = SUB81(local_a8 + 0x10,0);
                local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a8,"min relay fee not met","");
                local_178.ancestor_count =
                     CFeeRate::GetFee(&(this->m_pool->m_opts).min_relay_feerate,
                                      (uint32_t)ws->m_vsize);
                tinyformat::format<long,long>
                          ((string *)local_110,(tinyformat *)0x10f2eaa,(char *)nFeeDelta,
                           &local_178.ancestor_count,args_1);
                bVar16 = ValidationState<TxValidationResult>::Invalid
                                   (&this_01->super_ValidationState<TxValidationResult>,
                                    TX_MEMPOOL_POLICY,(string *)local_a8,(string *)local_110);
                goto LAB_00af131b;
              }
              if ((args->m_package_feerates == false) &&
                 (bVar17 = CheckFeeRate(this,ws->m_vsize,ws->m_modified_fees,this_01), !bVar17))
              goto LAB_00af1591;
            }
            CTxMemPool::GetIterSet((setEntries *)local_a8,this->m_pool,&ws->m_conflicts);
            std::_Rb_tree<$270907ca$>::clear(&(ws->m_iters_conflicting)._M_t);
            p_Var13 = (_Base_ptr)CONCAT44(aaStack_98[1]._4_4_,aaStack_98[1]._0_4_);
            p_Var12 = (_Base_ptr)
                      CONCAT71(aaStack_98[0]._M_allocated_capacity._1_7_,
                               aaStack_98[0]._M_local_buf[0]);
            if (p_Var12 != (_Base_ptr)0x0) {
              p_Var13 = (_Base_ptr)(local_a8 + 8);
              (ws->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   local_a8._8_4_;
              (ws->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   p_Var12;
              (ws->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)CONCAT71(aaStack_98[0]._9_7_,aaStack_98[0]._M_local_buf[8]);
              (ws->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)CONCAT44(aaStack_98[1]._4_4_,aaStack_98[1]._0_4_);
              p_Var12->_M_parent =
                   &(ws->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header._M_header;
              (ws->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   aaStack_98[1]._8_8_;
              aaStack_98[0]._M_local_buf[0] = '\0';
              aaStack_98[0]._M_allocated_capacity._1_7_ = 0;
              aaStack_98[0]._M_local_buf[8] = SUB81(p_Var13,0);
              aaStack_98[0]._9_7_ = (undefined7)((ulong)p_Var13 >> 8);
              aaStack_98[1]._8_8_ = 0;
            }
            aaStack_98[1]._0_8_ = p_Var13;
            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)local_a8);
            pCVar4 = this->m_pool;
            local_178.ancestor_count = (pCVar4->m_opts).limits.ancestor_count;
            local_178.ancestor_size_vbytes = (pCVar4->m_opts).limits.ancestor_size_vbytes;
            local_178.descendant_count = (pCVar4->m_opts).limits.descendant_count;
            local_178.descendant_size_vbytes = (pCVar4->m_opts).limits.descendant_size_vbytes;
            if (((ws->m_conflicts)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) &&
               (args->m_allow_carveouts == true)) {
              if ((ws->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header._M_node_count != 1) {
                __assert_fail("ws.m_iters_conflicting.size() == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                              ,0x3de,
                              "bool (anonymous namespace)::MemPoolAccept::PreChecks(ATMPArgs &, Workspace &)"
                             );
              }
              local_178.descendant_count = local_178.descendant_count + 1;
              local_178.descendant_size_vbytes =
                   *(long *)(*(long *)((ws->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header.
                                       _M_header._M_left + 1) + 0xd0) +
                   local_178.descendant_size_vbytes;
            }
            CTxMemPool::CalculateMemPoolAncestors
                      ((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                        *)local_a8,pCVar4,
                       (this_02->_M_t).
                       super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>
                       .super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl,&local_178,true
                      );
            if (local_68 == '\x01') {
              pTVar26 = util::
                        Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                        ::value((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                 *)local_a8);
              std::
              set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
              ::operator=(&ws->m_ancestors,pTVar26);
              std::__detail::__variant::
              _Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
              ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                   *)local_a8);
            }
            else {
              util::
              ErrorString<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>>
                        ((bilingual_str *)local_110,(util *)local_a8,result);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._0_8_ == local_100) {
                local_b8._8_8_ = local_100[0]._8_8_;
                local_c8.field2 = &local_b8;
              }
              else {
                local_c8.field2 = local_110._0_8_;
              }
              local_b8._M_allocated_capacity._1_7_ = local_100[0]._M_allocated_capacity._1_7_;
              local_b8._M_local_buf[0] = local_100[0]._M_local_buf[0];
              local_c0 = local_110._8_8_;
              local_110._8_8_ = 0;
              local_100[0]._M_local_buf[0] = '\0';
              local_110._0_8_ = local_100;
              bilingual_str::~bilingual_str((bilingual_str *)local_110);
              if (args->m_allow_carveouts == false) {
                local_110._0_8_ = local_100;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_110,"too-long-mempool-chain","");
                bVar16 = ValidationState<TxValidationResult>::Invalid
                                   (&this_01->super_ValidationState<TxValidationResult>,
                                    TX_MEMPOOL_POLICY,(string *)local_110,
                                    (string *)&local_c8._M_value);
LAB_00af176f:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._0_8_ != local_100) {
                  operator_delete((void *)local_110._0_8_,
                                  CONCAT71(local_100[0]._M_allocated_capacity._1_7_,
                                           local_100[0]._M_local_buf[0]) + 1);
                }
                bVar17 = false;
              }
              else {
                local_198.ancestor_count = 2;
                local_198.descendant_count = local_178.descendant_count + 1;
                local_198.descendant_size_vbytes = local_178.descendant_size_vbytes + 10000;
                local_198.ancestor_size_vbytes = local_178.ancestor_size_vbytes;
                if ((10000 < ws->m_vsize) ||
                   (((ws->m_ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr)->version == 3)) {
                  local_110._0_8_ = local_100;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_110,"too-long-mempool-chain","");
                  bVar16 = ValidationState<TxValidationResult>::Invalid
                                     (&this_01->super_ValidationState<TxValidationResult>,
                                      TX_MEMPOOL_POLICY,(string *)local_110,
                                      (string *)&local_c8._M_value);
                  goto LAB_00af176f;
                }
                CTxMemPool::CalculateMemPoolAncestors
                          ((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                            *)local_110,this->m_pool,
                           (this_02->_M_t).
                           super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>
                           .super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl,&local_198,
                           true);
                bVar17 = local_d0 == '\x01';
                if (bVar17) {
                  pTVar26 = util::
                            Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                            ::value((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                     *)local_110);
                  std::
                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                  ::operator=(&ws->m_ancestors,pTVar26);
                }
                else {
                  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_130,"too-long-mempool-chain","");
                  bVar16 = ValidationState<TxValidationResult>::Invalid
                                     (&this_01->super_ValidationState<TxValidationResult>,
                                      TX_MEMPOOL_POLICY,&local_130,(string *)&local_c8._M_value);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_130._M_dataplus._M_p != &local_130.field_2) {
                    operator_delete(local_130._M_dataplus._M_p,
                                    local_130.field_2._M_allocated_capacity + 1);
                  }
                }
                std::__detail::__variant::
                _Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                     *)local_110);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8.field2 != &local_b8) {
                operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
              }
              std::__detail::__variant::
              _Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
              ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                   *)local_a8);
              if (!bVar17) goto LAB_00af0ab7;
            }
            SingleTRUCChecks_abi_cxx11_
                      ((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                        *)local_a8,ws->m_ptx,&ws->m_ancestors,&ws->m_conflicts,ws->m_vsize);
            bVar17 = true;
            if (aaStack_98[2]._0_1_ == '\x01') {
              if ((args->m_allow_sibling_eviction == true) &&
                 ((_Base_ptr)aaStack_98[1]._0_8_ != (_Base_ptr)0x0)) {
                std::
                _Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
                ::_M_insert_unique<transaction_identifier<false>const&>
                          ((_Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
                            *)ws,(transaction_identifier<false> *)(aaStack_98[1]._0_8_ + 0x39));
                oVar31 = CTxMemPool::GetIter(this->m_pool,(uint256 *)(aaStack_98[1]._0_8_ + 0x39));
                local_110._0_8_ =
                     oVar31.
                     super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                     ._M_payload;
                local_110[8] = oVar31.
                               super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                               ._M_engaged;
                if (((undefined1  [16])
                     oVar31.
                     super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                    & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    std::__throw_bad_optional_access();
                  }
                  goto LAB_00af1fa8;
                }
                std::
                _Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<...lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
                ::
                _M_insert_unique<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>
                          ((_Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<___lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
                            *)&ws->m_iters_conflicting,
                           (hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                            *)local_110);
                ws->m_sibling_eviction = true;
              }
              else {
                local_110._0_8_ = local_100;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_110,"TRUC-violation","");
                bVar16 = ValidationState<TxValidationResult>::Invalid
                                   (&this_01->super_ValidationState<TxValidationResult>,
                                    TX_MEMPOOL_POLICY,(string *)local_110,(string *)local_a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._0_8_ != local_100) {
                  operator_delete((void *)local_110._0_8_,
                                  CONCAT71(local_100[0]._M_allocated_capacity._1_7_,
                                           local_100[0]._M_local_buf[0]) + 1);
                }
                bVar17 = false;
              }
            }
            if (aaStack_98[2]._0_1_ == '\x01') {
              std::
              _Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
              ::_M_destroy((_Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                            *)local_a8);
            }
            local_a8._8_8_ = (SizeComputer *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
            if (bVar17) {
              EntriesAndTxidsDisjoint_abi_cxx11_
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_a8,&ws->m_ancestors,&ws->m_conflicts,&hash->m_wrapped);
              uVar14 = aaStack_98[1]._0_1_;
              uVar18 = aaStack_98[1]._0_1_;
              uVar8 = aaStack_98[1]._0_8_;
              if (aaStack_98[1]._0_1_ == 1) {
                local_110._0_8_ = local_100;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_110,"bad-txns-spends-conflicting-tx","");
                bVar16 = ValidationState<TxValidationResult>::Invalid
                                   (&this_01->super_ValidationState<TxValidationResult>,TX_CONSENSUS
                                    ,(string *)local_110,(string *)local_a8);
                uVar8 = aaStack_98[1]._0_8_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._0_8_ != local_100) {
                  operator_delete((void *)local_110._0_8_,
                                  CONCAT71(local_100[0]._M_allocated_capacity._1_7_,
                                           local_100[0]._M_local_buf[0]) + 1);
                  uVar8 = aaStack_98[1]._0_8_;
                }
                aaStack_98[1]._0_1_ = (undefined1)uVar8;
                uVar18 = aaStack_98[1]._0_1_;
              }
              aaStack_98[1]._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
              aaStack_98[1]._0_4_ = (undefined4)uVar8;
              if ((uVar18 & 1) != 0) {
                aaStack_98[1]._0_4_ = aaStack_98[1]._0_4_ & 0xffffff00;
                uVar8 = (_Base_ptr)(uVar8 & 0xffffffffffffff00);
                if ((undefined1 *)CONCAT71(local_a8._1_7_,local_a8[0]) != local_a8 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_a8._1_7_,local_a8[0]),
                                  CONCAT71(aaStack_98[0]._M_allocated_capacity._1_7_,
                                           aaStack_98[0]._M_local_buf[0]) + 1);
                  uVar8 = (_Base_ptr)CONCAT44(aaStack_98[1]._4_4_,aaStack_98[1]._0_4_);
                }
              }
              aaStack_98[1]._0_8_ = uVar8;
              local_a8._8_8_ = (SizeComputer *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
              if (uVar14 == 0) {
                pbVar1 = &(this->m_subpackage).m_rbf;
                *pbVar1 = (bool)(*pbVar1 |
                                (ws->m_conflicts)._M_t._M_impl.super__Rb_tree_header._M_node_count
                                != 0);
                bVar16 = 1;
                local_a8._8_8_ = (SizeComputer *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
              }
            }
            goto LAB_00af0ab7;
          }
          local_a8[0] = SUB81(local_a8 + 0x10,0);
          local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a8,"bad-txns-too-many-sigops","");
          tinyformat::format<long>((string *)local_110,"%d",&local_158);
          bVar16 = ValidationState<TxValidationResult>::Invalid
                             (&this_01->super_ValidationState<TxValidationResult>,TX_NOT_STANDARD,
                              (string *)local_a8,(string *)local_110);
LAB_00af131b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._0_8_ == local_100) goto LAB_00af0a9a;
          goto LAB_00af0a8a;
        }
LAB_00af1591:
        bVar16 = 0;
      }
      else {
        local_a8[0] = SUB81(local_a8 + 0x10,0);
        local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
        bVar16 = ValidationState<TxValidationResult>::Invalid
                           (&this_01->super_ValidationState<TxValidationResult>,TX_NOT_STANDARD,
                            &local_58,(string *)local_a8);
LAB_00af0a9a:
        if ((undefined1 *)CONCAT71(local_a8._1_7_,local_a8[0]) != local_a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_a8._1_7_,local_a8[0]),
                          CONCAT71(aaStack_98[0]._M_allocated_capacity._1_7_,
                                   aaStack_98[0]._M_local_buf[0]) + 1);
        }
      }
LAB_00af0ab7:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_00af0adc;
      lVar27 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                        local_58.field_2._M_local_buf[0]);
      _Var28._M_p = local_58._M_dataplus._M_p;
    }
    operator_delete(_Var28._M_p,lVar27 + 1);
  }
  else {
    bVar16 = 0;
  }
LAB_00af0adc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar16 & 1);
  }
LAB_00af1fa8:
  __stack_chk_fail();
  while (uVar30 = uVar30 + 1,
        uVar30 < (ulong)(((long)(tx_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(tx_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333
                        )) {
LAB_00af0da3:
    uVar8 = *(undefined8 *)(hash->m_wrapped).super_base_blob<256U>.m_data._M_elems;
    uVar9 = *(undefined8 *)((hash->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
    uVar10 = *(undefined8 *)((hash->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
    uVar11 = *(undefined8 *)((hash->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
    aaStack_98[0]._M_local_buf[0] = (undefined1)uVar10;
    aaStack_98[0]._M_allocated_capacity._1_7_ = (undefined7)((ulong)uVar10 >> 8);
    aaStack_98[0]._M_local_buf[8] = (undefined1)uVar11;
    aaStack_98[0]._9_7_ = (undefined7)((ulong)uVar11 >> 8);
    local_a8[0] = (undefined1)uVar8;
    local_a8._1_7_ = (undefined7)((ulong)uVar8 >> 8);
    local_a8._8_4_ = (undefined4)uVar9;
    local_a8._12_4_ = (undefined4)((ulong)uVar9 >> 0x20);
    aaStack_98[1]._0_4_ = (undefined4)uVar30;
    bVar17 = CCoinsViewCache::HaveCoinInCache(this_05,(COutPoint *)local_a8);
    if (bVar17) {
      local_a8[0] = SUB81(local_a8 + 0x10,0);
      local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"txn-already-known","");
      local_110._0_8_ = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
      bVar16 = ValidationState<TxValidationResult>::Invalid
                         (&this_01->super_ValidationState<TxValidationResult>,TX_CONFLICT,
                          (string *)local_a8,(string *)local_110);
      goto LAB_00af0a7b;
    }
  }
LAB_00af0df8:
  local_a8[0] = SUB81(local_a8 + 0x10,0);
  local_a8._1_7_ = (undefined7)((ulong)(local_a8 + 0x10) >> 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"bad-txns-inputs-missingorspent","");
  local_110._0_8_ = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
  bVar16 = ValidationState<TxValidationResult>::Invalid
                     (&this_01->super_ValidationState<TxValidationResult>,TX_MISSING_INPUTS,
                      (string *)local_a8,(string *)local_110);
  goto LAB_00af0a7b;
}

Assistant:

bool MemPoolAccept::PreChecks(ATMPArgs& args, Workspace& ws)
{
    AssertLockHeld(cs_main);
    AssertLockHeld(m_pool.cs);
    const CTransactionRef& ptx = ws.m_ptx;
    const CTransaction& tx = *ws.m_ptx;
    const Txid& hash = ws.m_hash;

    // Copy/alias what we need out of args
    const int64_t nAcceptTime = args.m_accept_time;
    const bool bypass_limits = args.m_bypass_limits;
    std::vector<COutPoint>& coins_to_uncache = args.m_coins_to_uncache;

    // Alias what we need out of ws
    TxValidationState& state = ws.m_state;
    std::unique_ptr<CTxMemPoolEntry>& entry = ws.m_entry;

    if (!CheckTransaction(tx, state)) {
        return false; // state filled in by CheckTransaction
    }

    // Coinbase is only valid in a block, not as a loose transaction
    if (tx.IsCoinBase())
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "coinbase");

    // Rather not work on nonstandard transactions (unless -testnet/-regtest)
    std::string reason;
    if (m_pool.m_opts.require_standard && !IsStandardTx(tx, m_pool.m_opts.max_datacarrier_bytes, m_pool.m_opts.permit_bare_multisig, m_pool.m_opts.dust_relay_feerate, reason)) {
        return state.Invalid(TxValidationResult::TX_NOT_STANDARD, reason);
    }

    // Transactions smaller than 65 non-witness bytes are not relayed to mitigate CVE-2017-12842.
    if (::GetSerializeSize(TX_NO_WITNESS(tx)) < MIN_STANDARD_TX_NONWITNESS_SIZE)
        return state.Invalid(TxValidationResult::TX_NOT_STANDARD, "tx-size-small");

    // Only accept nLockTime-using transactions that can be mined in the next
    // block; we don't want our mempool filled up with transactions that can't
    // be mined yet.
    if (!CheckFinalTxAtTip(*Assert(m_active_chainstate.m_chain.Tip()), tx)) {
        return state.Invalid(TxValidationResult::TX_PREMATURE_SPEND, "non-final");
    }

    if (m_pool.exists(GenTxid::Wtxid(tx.GetWitnessHash()))) {
        // Exact transaction already exists in the mempool.
        return state.Invalid(TxValidationResult::TX_CONFLICT, "txn-already-in-mempool");
    } else if (m_pool.exists(GenTxid::Txid(tx.GetHash()))) {
        // Transaction with the same non-witness data but different witness (same txid, different
        // wtxid) already exists in the mempool.
        return state.Invalid(TxValidationResult::TX_CONFLICT, "txn-same-nonwitness-data-in-mempool");
    }

    // Check for conflicts with in-memory transactions
    for (const CTxIn &txin : tx.vin)
    {
        const CTransaction* ptxConflicting = m_pool.GetConflictTx(txin.prevout);
        if (ptxConflicting) {
            if (!args.m_allow_replacement) {
                // Transaction conflicts with a mempool tx, but we're not allowing replacements.
                return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "bip125-replacement-disallowed");
            }
            if (!ws.m_conflicts.count(ptxConflicting->GetHash()))
            {
                // Transactions that don't explicitly signal replaceability are
                // *not* replaceable with the current logic, even if one of their
                // unconfirmed ancestors signals replaceability. This diverges
                // from BIP125's inherited signaling description (see CVE-2021-31876).
                // Applications relying on first-seen mempool behavior should
                // check all unconfirmed ancestors; otherwise an opt-in ancestor
                // might be replaced, causing removal of this descendant.
                //
                // All TRUC transactions are considered replaceable.
                //
                // Replaceability signaling of the original transactions may be
                // ignored due to node setting.
                const bool allow_rbf{m_pool.m_opts.full_rbf || SignalsOptInRBF(*ptxConflicting) || ptxConflicting->version == TRUC_VERSION};
                if (!allow_rbf) {
                    return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "txn-mempool-conflict");
                }

                ws.m_conflicts.insert(ptxConflicting->GetHash());
            }
        }
    }

    m_view.SetBackend(m_viewmempool);

    const CCoinsViewCache& coins_cache = m_active_chainstate.CoinsTip();
    // do all inputs exist?
    for (const CTxIn& txin : tx.vin) {
        if (!coins_cache.HaveCoinInCache(txin.prevout)) {
            coins_to_uncache.push_back(txin.prevout);
        }

        // Note: this call may add txin.prevout to the coins cache
        // (coins_cache.cacheCoins) by way of FetchCoin(). It should be removed
        // later (via coins_to_uncache) if this tx turns out to be invalid.
        if (!m_view.HaveCoin(txin.prevout)) {
            // Are inputs missing because we already have the tx?
            for (size_t out = 0; out < tx.vout.size(); out++) {
                // Optimistically just do efficient check of cache for outputs
                if (coins_cache.HaveCoinInCache(COutPoint(hash, out))) {
                    return state.Invalid(TxValidationResult::TX_CONFLICT, "txn-already-known");
                }
            }
            // Otherwise assume this might be an orphan tx for which we just haven't seen parents yet
            return state.Invalid(TxValidationResult::TX_MISSING_INPUTS, "bad-txns-inputs-missingorspent");
        }
    }

    // This is const, but calls into the back end CoinsViews. The CCoinsViewDB at the bottom of the
    // hierarchy brings the best block into scope. See CCoinsViewDB::GetBestBlock().
    m_view.GetBestBlock();

    // we have all inputs cached now, so switch back to dummy (to protect
    // against bugs where we pull more inputs from disk that miss being added
    // to coins_to_uncache)
    m_view.SetBackend(m_dummy);

    assert(m_active_chainstate.m_blockman.LookupBlockIndex(m_view.GetBestBlock()) == m_active_chainstate.m_chain.Tip());

    // Only accept BIP68 sequence locked transactions that can be mined in the next
    // block; we don't want our mempool filled up with transactions that can't
    // be mined yet.
    // Pass in m_view which has all of the relevant inputs cached. Note that, since m_view's
    // backend was removed, it no longer pulls coins from the mempool.
    const std::optional<LockPoints> lock_points{CalculateLockPointsAtTip(m_active_chainstate.m_chain.Tip(), m_view, tx)};
    if (!lock_points.has_value() || !CheckSequenceLocksAtTip(m_active_chainstate.m_chain.Tip(), *lock_points)) {
        return state.Invalid(TxValidationResult::TX_PREMATURE_SPEND, "non-BIP68-final");
    }

    // The mempool holds txs for the next block, so pass height+1 to CheckTxInputs
    if (!Consensus::CheckTxInputs(tx, state, m_view, m_active_chainstate.m_chain.Height() + 1, ws.m_base_fees)) {
        return false; // state filled in by CheckTxInputs
    }

    if (m_pool.m_opts.require_standard && !AreInputsStandard(tx, m_view)) {
        return state.Invalid(TxValidationResult::TX_INPUTS_NOT_STANDARD, "bad-txns-nonstandard-inputs");
    }

    // Check for non-standard witnesses.
    if (tx.HasWitness() && m_pool.m_opts.require_standard && !IsWitnessStandard(tx, m_view)) {
        return state.Invalid(TxValidationResult::TX_WITNESS_MUTATED, "bad-witness-nonstandard");
    }

    int64_t nSigOpsCost = GetTransactionSigOpCost(tx, m_view, STANDARD_SCRIPT_VERIFY_FLAGS);

    // ws.m_modified_fees includes any fee deltas from PrioritiseTransaction
    ws.m_modified_fees = ws.m_base_fees;
    m_pool.ApplyDelta(hash, ws.m_modified_fees);

    // Keep track of transactions that spend a coinbase, which we re-scan
    // during reorgs to ensure COINBASE_MATURITY is still met.
    bool fSpendsCoinbase = false;
    for (const CTxIn &txin : tx.vin) {
        const Coin &coin = m_view.AccessCoin(txin.prevout);
        if (coin.IsCoinBase()) {
            fSpendsCoinbase = true;
            break;
        }
    }

    // Set entry_sequence to 0 when bypass_limits is used; this allows txs from a block
    // reorg to be marked earlier than any child txs that were already in the mempool.
    const uint64_t entry_sequence = bypass_limits ? 0 : m_pool.GetSequence();
    entry.reset(new CTxMemPoolEntry(ptx, ws.m_base_fees, nAcceptTime, m_active_chainstate.m_chain.Height(), entry_sequence,
                                    fSpendsCoinbase, nSigOpsCost, lock_points.value()));
    ws.m_vsize = entry->GetTxSize();

    if (nSigOpsCost > MAX_STANDARD_TX_SIGOPS_COST)
        return state.Invalid(TxValidationResult::TX_NOT_STANDARD, "bad-txns-too-many-sigops",
                strprintf("%d", nSigOpsCost));

    // No individual transactions are allowed below the min relay feerate except from disconnected blocks.
    // This requirement, unlike CheckFeeRate, cannot be bypassed using m_package_feerates because,
    // while a tx could be package CPFP'd when entering the mempool, we do not have a DoS-resistant
    // method of ensuring the tx remains bumped. For example, the fee-bumping child could disappear
    // due to a replacement.
    // The only exception is TRUC transactions.
    if (!bypass_limits && ws.m_ptx->version != TRUC_VERSION && ws.m_modified_fees < m_pool.m_opts.min_relay_feerate.GetFee(ws.m_vsize)) {
        // Even though this is a fee-related failure, this result is TX_MEMPOOL_POLICY, not
        // TX_RECONSIDERABLE, because it cannot be bypassed using package validation.
        return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "min relay fee not met",
                             strprintf("%d < %d", ws.m_modified_fees, m_pool.m_opts.min_relay_feerate.GetFee(ws.m_vsize)));
    }
    // No individual transactions are allowed below the mempool min feerate except from disconnected
    // blocks and transactions in a package. Package transactions will be checked using package
    // feerate later.
    if (!bypass_limits && !args.m_package_feerates && !CheckFeeRate(ws.m_vsize, ws.m_modified_fees, state)) return false;

    ws.m_iters_conflicting = m_pool.GetIterSet(ws.m_conflicts);

    // Note that these modifications are only applicable to single transaction scenarios;
    // carve-outs are disabled for multi-transaction evaluations.
    CTxMemPool::Limits maybe_rbf_limits = m_pool.m_opts.limits;

    // Calculate in-mempool ancestors, up to a limit.
    if (ws.m_conflicts.size() == 1 && args.m_allow_carveouts) {
        // In general, when we receive an RBF transaction with mempool conflicts, we want to know whether we
        // would meet the chain limits after the conflicts have been removed. However, there isn't a practical
        // way to do this short of calculating the ancestor and descendant sets with an overlay cache of
        // changed mempool entries. Due to both implementation and runtime complexity concerns, this isn't
        // very realistic, thus we only ensure a limited set of transactions are RBF'able despite mempool
        // conflicts here. Importantly, we need to ensure that some transactions which were accepted using
        // the below carve-out are able to be RBF'ed, without impacting the security the carve-out provides
        // for off-chain contract systems (see link in the comment below).
        //
        // Specifically, the subset of RBF transactions which we allow despite chain limits are those which
        // conflict directly with exactly one other transaction (but may evict children of said transaction),
        // and which are not adding any new mempool dependencies. Note that the "no new mempool dependencies"
        // check is accomplished later, so we don't bother doing anything about it here, but if our
        // policy changes, we may need to move that check to here instead of removing it wholesale.
        //
        // Such transactions are clearly not merging any existing packages, so we are only concerned with
        // ensuring that (a) no package is growing past the package size (not count) limits and (b) we are
        // not allowing something to effectively use the (below) carve-out spot when it shouldn't be allowed
        // to.
        //
        // To check these we first check if we meet the RBF criteria, above, and increment the descendant
        // limits by the direct conflict and its descendants (as these are recalculated in
        // CalculateMempoolAncestors by assuming the new transaction being added is a new descendant, with no
        // removals, of each parent's existing dependent set). The ancestor count limits are unmodified (as
        // the ancestor limits should be the same for both our new transaction and any conflicts).
        // We don't bother incrementing m_limit_descendants by the full removal count as that limit never comes
        // into force here (as we're only adding a single transaction).
        assert(ws.m_iters_conflicting.size() == 1);
        CTxMemPool::txiter conflict = *ws.m_iters_conflicting.begin();

        maybe_rbf_limits.descendant_count += 1;
        maybe_rbf_limits.descendant_size_vbytes += conflict->GetSizeWithDescendants();
    }

    if (auto ancestors{m_pool.CalculateMemPoolAncestors(*entry, maybe_rbf_limits)}) {
        ws.m_ancestors = std::move(*ancestors);
    } else {
        // If CalculateMemPoolAncestors fails second time, we want the original error string.
        const auto error_message{util::ErrorString(ancestors).original};

        // Carve-out is not allowed in this context; fail
        if (!args.m_allow_carveouts) {
            return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "too-long-mempool-chain", error_message);
        }

        // Contracting/payment channels CPFP carve-out:
        // If the new transaction is relatively small (up to 40k weight)
        // and has at most one ancestor (ie ancestor limit of 2, including
        // the new transaction), allow it if its parent has exactly the
        // descendant limit descendants. The transaction also cannot be TRUC,
        // as its topology restrictions do not allow a second child.
        //
        // This allows protocols which rely on distrusting counterparties
        // being able to broadcast descendants of an unconfirmed transaction
        // to be secure by simply only having two immediately-spendable
        // outputs - one for each counterparty. For more info on the uses for
        // this, see https://lists.linuxfoundation.org/pipermail/bitcoin-dev/2018-November/016518.html
        CTxMemPool::Limits cpfp_carve_out_limits{
            .ancestor_count = 2,
            .ancestor_size_vbytes = maybe_rbf_limits.ancestor_size_vbytes,
            .descendant_count = maybe_rbf_limits.descendant_count + 1,
            .descendant_size_vbytes = maybe_rbf_limits.descendant_size_vbytes + EXTRA_DESCENDANT_TX_SIZE_LIMIT,
        };
        if (ws.m_vsize > EXTRA_DESCENDANT_TX_SIZE_LIMIT || ws.m_ptx->version == TRUC_VERSION) {
            return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "too-long-mempool-chain", error_message);
        }
        if (auto ancestors_retry{m_pool.CalculateMemPoolAncestors(*entry, cpfp_carve_out_limits)}) {
            ws.m_ancestors = std::move(*ancestors_retry);
        } else {
            return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "too-long-mempool-chain", error_message);
        }
    }

    // Even though just checking direct mempool parents for inheritance would be sufficient, we
    // check using the full ancestor set here because it's more convenient to use what we have
    // already calculated.
    if (const auto err{SingleTRUCChecks(ws.m_ptx, ws.m_ancestors, ws.m_conflicts, ws.m_vsize)}) {
        // Single transaction contexts only.
        if (args.m_allow_sibling_eviction && err->second != nullptr) {
            // We should only be considering where replacement is considered valid as well.
            Assume(args.m_allow_replacement);

            // Potential sibling eviction. Add the sibling to our list of mempool conflicts to be
            // included in RBF checks.
            ws.m_conflicts.insert(err->second->GetHash());
            // Adding the sibling to m_iters_conflicting here means that it doesn't count towards
            // RBF Carve Out above. This is correct, since removing to-be-replaced transactions from
            // the descendant count is done separately in SingleTRUCChecks for TRUC transactions.
            ws.m_iters_conflicting.insert(m_pool.GetIter(err->second->GetHash()).value());
            ws.m_sibling_eviction = true;
            // The sibling will be treated as part of the to-be-replaced set in ReplacementChecks.
            // Note that we are not checking whether it opts in to replaceability via BIP125 or TRUC
            // (which is normally done in PreChecks). However, the only way a TRUC transaction can
            // have a non-TRUC and non-BIP125 descendant is due to a reorg.
        } else {
            return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "TRUC-violation", err->first);
        }
    }

    // A transaction that spends outputs that would be replaced by it is invalid. Now
    // that we have the set of all ancestors we can detect this
    // pathological case by making sure ws.m_conflicts and ws.m_ancestors don't
    // intersect.
    if (const auto err_string{EntriesAndTxidsDisjoint(ws.m_ancestors, ws.m_conflicts, hash)}) {
        // We classify this as a consensus error because a transaction depending on something it
        // conflicts with would be inconsistent.
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-spends-conflicting-tx", *err_string);
    }

    // We want to detect conflicts in any tx in a package to trigger package RBF logic
    m_subpackage.m_rbf |= !ws.m_conflicts.empty();
    return true;
}